

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O0

size_t URL_PrintableChar(uchar charVal,char *buffer)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  byte local_23;
  uchar littleNibbleVal;
  uchar bigNibbleVal;
  char littleNibbleStr;
  size_t sStack_20;
  char bigNibbleStr;
  size_t size;
  char *buffer_local;
  uchar charVal_local;
  
  if ((((((((charVal == '\0') || (charVal == '!')) || (charVal == '(')) ||
         ((charVal == ')' || (charVal == '*')))) || ((charVal == '-' || (charVal == '.')))) ||
       ((0x2f < charVal && (charVal < 0x3a)))) || ((0x40 < charVal && (charVal < 0x5b)))) ||
     ((charVal == '_' || ((0x60 < charVal && (charVal < 0x7b)))))) {
    *buffer = charVal;
    sStack_20 = 1;
  }
  else {
    local_23 = (byte)((int)(uint)charVal >> 4);
    bVar1 = charVal & 0xf;
    if (0xb < local_23) {
      local_23 = local_23 - 4;
    }
    if (local_23 < 10) {
      cVar2 = local_23 + 0x30;
    }
    else {
      cVar2 = local_23 + 0x57;
    }
    if (bVar1 < 10) {
      cVar3 = bVar1 + 0x30;
    }
    else {
      cVar3 = bVar1 + 0x57;
    }
    *buffer = '%';
    if (charVal < 0x80) {
      buffer[1] = cVar2;
      buffer[2] = cVar3;
      sStack_20 = 3;
    }
    else {
      buffer[1] = 'c';
      buffer[3] = '%';
      buffer[4] = cVar2;
      buffer[5] = cVar3;
      if (charVal < 0xc0) {
        buffer[2] = '2';
      }
      else {
        buffer[2] = '3';
      }
      sStack_20 = 6;
    }
  }
  return sStack_20;
}

Assistant:

static size_t URL_PrintableChar(unsigned char charVal, char* buffer)
{
    size_t size;
    if (IS_PRINTABLE(charVal))
    {
        buffer[0] = (char)charVal;
        size = 1;
    }
    else
    {
        char bigNibbleStr;
        char littleNibbleStr;
        unsigned char bigNibbleVal = charVal >> 4;
        unsigned char littleNibbleVal = charVal & 0x0F;

        if (bigNibbleVal >= 0x0C)
        {
            bigNibbleVal -= 0x04;
        }

        bigNibbleStr = NIBBLE_TO_STRING(bigNibbleVal);
        littleNibbleStr = NIBBLE_TO_STRING(littleNibbleVal);

        buffer[0] = '%';

        if (charVal < 0x80)
        {
            buffer[1] = bigNibbleStr;
            buffer[2] = littleNibbleStr;
            size = 3;
        }
        else
        {
            buffer[1] = 'c';
            buffer[3] = '%';
            buffer[4] = bigNibbleStr;
            buffer[5] = littleNibbleStr;
            if (charVal < 0xC0)
            {
                buffer[2] = '2';
            }
            else
            {
                buffer[2] = '3';
            }
            size = 6;
        }
    }

    return size;
}